

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  int p4type;
  long lVar1;
  
  if (aOp != (Op *)0x0) {
    lVar1 = (long)nOp * 0x18;
    do {
      p4type = (int)*(char *)((long)aOp + lVar1 + -0x17);
      if (p4type < -5) {
        freeP4(db,p4type,*(void **)((long)aOp + lVar1 + -8));
      }
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != 0);
    sqlite3DbFreeNN(db,aOp);
    return;
  }
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  assert( nOp>=0 );
  if( aOp ){
    Op *pOp = &aOp[nOp-1];
    while(1){  /* Exit via break */
      if( pOp->p4type <= P4_FREE_IF_LE ) freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif
      if( pOp==aOp ) break;
      pOp--;
    }
    sqlite3DbFreeNN(db, aOp);
  }
}